

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

ScriptFunction *
Js::ScriptFunction::OP_NewScFunc(FrameDisplay *environment,FunctionInfoPtrPtr infoRef)

{
  Type *addr;
  FunctionBody *this;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 uVar5;
  int iVar6;
  undefined4 *puVar7;
  ScriptContext *pSVar8;
  ScriptFunctionWithInlineCache *this_00;
  char16 *pcVar9;
  undefined4 extraout_var;
  ScriptFunctionType *pSVar10;
  ScriptFunctionType *pSVar11;
  DynamicTypeHandler *pDVar12;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  if (infoRef == (FunctionInfoPtrPtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x3a,"(infoRef!= nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar3) goto LAB_00d46e71;
    *puVar7 = 0;
  }
  this = (FunctionBody *)(infoRef->ptr->functionBodyImpl).ptr;
  if (this == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x3c,"(functionProxy!= nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar3) goto LAB_00d46e71;
    *puVar7 = 0;
  }
  pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
  pTVar1 = pSVar8->threadContext;
  debugStringBuffer[0x27]._1_1_ = pTVar1->noJsReentrancy;
  pTVar1->noJsReentrancy = true;
  bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
  if (bVar3) {
    bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar3) goto LAB_00d46e71;
      *puVar7 = 0;
    }
    if ((this->field_0x17a & 8) != 0) {
      bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar3) goto LAB_00d46e71;
        *puVar7 = 0;
      }
      if ((*(uint *)&this->field_0x178 >> 0x12 & 1) == 0) {
        this_00 = JavascriptLibrary::CreateScriptFunctionWithInlineCache
                            ((pSVar8->super_ScriptContextBase).javascriptLibrary,
                             (FunctionProxy *)this);
        ScriptFunctionWithInlineCache::CreateInlineCache(this_00);
        uVar4 = FunctionBody::GetCountField(this,InlineCacheCount);
        uVar5 = FunctionBody::GetCountField(this,IsInstInlineCacheCount);
        if (uVar4 + uVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                      ,0x4e,
                                      "(functionBody->GetInlineCacheCount() + functionBody->GetIsInstInlineCacheCount())"
                                      ,
                                      "functionBody->GetInlineCacheCount() + functionBody->GetIsInstInlineCacheCount()"
                                     );
          if (!bVar3) {
LAB_00d46e71:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
        bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,ScriptFunctionWithInlineCachePhase);
        if (bVar3) {
          pcVar9 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_88);
          iVar6 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
          Output::Print(L"Function object with inline cache: function number: (%s)\tfunction name: %s\n"
                        ,pcVar9,CONCAT44(extraout_var,iVar6));
          Output::Flush();
        }
        goto LAB_00d46e08;
      }
      *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xfffbffff;
    }
  }
  this_00 = (ScriptFunctionWithInlineCache *)
            JavascriptLibrary::CreateScriptFunction
                      ((pSVar8->super_ScriptContextBase).javascriptLibrary,(FunctionProxy *)this);
LAB_00d46e08:
  addr = &(this_00->super_ScriptFunction).environment;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = environment;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pSVar10 = FunctionProxy::GetUndeferredFunctionType((FunctionProxy *)this);
  if (pSVar10 != (ScriptFunctionType *)0x0) {
    pSVar10 = (ScriptFunctionType *)
              (this_00->super_ScriptFunction).super_ScriptFunctionBase.super_JavascriptFunction.
              super_DynamicObject.super_RecyclableObject.type.ptr;
    pSVar11 = FunctionProxy::GetDeferredPrototypeType((FunctionProxy *)this);
    if (pSVar10 == pSVar11) {
      pDVar12 = DynamicObject::GetTypeHandler((DynamicObject *)this_00);
      (*pDVar12->_vptr_DynamicTypeHandler[0x10])(pDVar12,this_00);
    }
  }
  pTVar1->noJsReentrancy = (bool)debugStringBuffer[0x27]._1_1_;
  return &this_00->super_ScriptFunction;
}

Assistant:

ScriptFunction * ScriptFunction::OP_NewScFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef)
    {
        AssertMsg(infoRef!= nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
        FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
        AssertMsg(functionProxy!= nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
        ScriptContext* scriptContext = functionProxy->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScFunc, reentrancylock, scriptContext->GetThreadContext());

        ScriptFunction * pfuncScript = nullptr;
        if (functionProxy->IsFunctionBody() && functionProxy->GetFunctionBody()->GetInlineCachesOnFunctionObject())
        {
            FunctionBody * functionBody = functionProxy->GetFunctionBody();
            if (functionBody->GetIsFirstFunctionObject())
            {
                functionBody->SetIsNotFirstFunctionObject();
            }
            else
            {
                ScriptFunctionWithInlineCache* pfuncScriptWithInlineCache = scriptContext->GetLibrary()->CreateScriptFunctionWithInlineCache(functionProxy);
                // allocate inline cache for this function object
                pfuncScriptWithInlineCache->CreateInlineCache();

                Assert(functionBody->GetInlineCacheCount() + functionBody->GetIsInstInlineCacheCount());
                if (PHASE_TRACE1(Js::ScriptFunctionWithInlineCachePhase))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                    Output::Print(_u("Function object with inline cache: function number: (%s)\tfunction name: %s\n"),
                        functionBody->GetDebugNumberSet(debugStringBuffer), functionBody->GetDisplayName());
                    Output::Flush();
                }

                pfuncScript = pfuncScriptWithInlineCache;
            }
        }

        if (pfuncScript == nullptr)
        {
            pfuncScript = scriptContext->GetLibrary()->CreateScriptFunction(functionProxy);
        }

        pfuncScript->SetEnvironment(environment);

        ScriptFunctionType *scFuncType = functionProxy->GetUndeferredFunctionType();
        if (scFuncType && pfuncScript->GetType() == functionProxy->GetDeferredPrototypeType())
        {
            pfuncScript->GetTypeHandler()->EnsureObjectReady(pfuncScript);
        }

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(pfuncScript, EtwTrace::GetFunctionId(functionProxy)));

        return pfuncScript;
        JIT_HELPER_END(ScrFunc_OP_NewScFunc);
    }